

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::distance_comparison_task
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  vec<6U,_float> *pvVar4;
  VectorInfo *pVVar5;
  bool *pbVar6;
  uint uVar7;
  distance_comparison_task_params *pParams;
  uint uVar8;
  ulong uVar9;
  uint i;
  long lVar10;
  float dist2;
  float fVar11;
  float dist2_1;
  float fVar12;
  float fVar13;
  
  iVar1 = *(int *)((long)pData_ptr + 0x10);
  uVar9 = (ulong)(uint)(*(int *)((long)pData_ptr + 0x14) - iVar1);
  uVar8 = (int)((uVar9 * data) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  uVar7 = (int)(((data + 1) * uVar9) / (ulong)*(uint *)((long)pData_ptr + 0x18)) + iVar1;
  if (uVar8 < uVar7) {
    lVar2 = *pData_ptr;
    lVar3 = *(long *)((long)pData_ptr + 8);
    pvVar4 = this->m_vectors;
    pVVar5 = (this->m_vectorsInfo).m_p;
    pbVar6 = (this->m_vectorComparison).m_p;
    uVar9 = (ulong)uVar8;
    do {
      uVar8 = pVVar5[uVar9].index;
      fVar11 = 0.0;
      lVar10 = 0;
      do {
        fVar12 = *(float *)(lVar2 + lVar10 * 4) - pvVar4[uVar8].m_s[lVar10];
        fVar11 = fVar11 + fVar12 * fVar12;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      fVar12 = 0.0;
      lVar10 = 0;
      do {
        fVar13 = *(float *)(lVar3 + lVar10 * 4) - pvVar4[uVar8].m_s[lVar10];
        fVar12 = fVar12 + fVar13 * fVar13;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      pbVar6[uVar9] = fVar11 < fVar12;
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar7);
  }
  return;
}

Assistant:

void distance_comparison_task(uint64 data, void* pData_ptr)
        {
            distance_comparison_task_params* pParams = (distance_comparison_task_params*)pData_ptr;
            const VectorType& left_child = *pParams->left_child;
            const VectorType& right_child = *pParams->right_child;
            uint begin = pParams->begin + (pParams->end - pParams->begin) * data / pParams->num_tasks;
            uint end = pParams->begin + (pParams->end - pParams->begin) * (data + 1) / pParams->num_tasks;
            for (uint i = begin; i < end; i++)
            {
                const VectorType& v = m_vectors[m_vectorsInfo[i].index];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                m_vectorComparison[i] = left_dist2 < right_dist2;
            }
        }